

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O1

void __thiscall Ptex::v2_2::PtexMainWriter::writeMetaData(PtexMainWriter *this,FILE *fp)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  MetaEntry *val;
  pointer pMVar3;
  void *data;
  undefined8 *puVar4;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  pointer pcVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint8_t keysize;
  uint8_t datatype;
  uint32_t datasize;
  uint32_t zipsize;
  vector<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
  lmdEntries;
  vector<unsigned_int,_std::allocator<unsigned_int>_> lmdzipsize;
  vector<long,_std::allocator<long>_> lmdoffset;
  byte local_92;
  undefined1 local_91;
  int local_90;
  uint local_8c;
  void *local_88;
  long lStack_80;
  long local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<long,_std::allocator<long>_> local_50;
  ulong local_38;
  
  local_88 = (void *)0x0;
  lStack_80 = 0;
  local_78 = 0;
  uVar12 = (uint)((ulong)((long)(this->super_PtexWriterBase)._metadata.
                                super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_PtexWriterBase)._metadata.
                               super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < (int)uVar12) {
    uVar16 = (ulong)(uVar12 & 0x7fffffff);
    lVar13 = 0;
    do {
      pMVar3 = (this->super_PtexWriterBase)._metadata.
               super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      val = (MetaEntry *)((long)&(pMVar3->key)._M_dataplus._M_p + lVar13);
      if (*(int *)((long)&(pMVar3->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar13 + 8) -
          *(int *)((long)&(pMVar3->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar13) < 0x401) {
        iVar9 = PtexWriterBase::writeMetaDataBlock(&this->super_PtexWriterBase,fp,val);
        puVar1 = &(this->super_PtexWriterBase)._header.metadatamemsize;
        *puVar1 = *puVar1 + iVar9;
      }
      else {
        local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)val;
        std::
        vector<Ptex::v2_2::PtexWriterBase::MetaEntry*,std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry*>>
        ::emplace_back<Ptex::v2_2::PtexWriterBase::MetaEntry*>
                  ((vector<Ptex::v2_2::PtexWriterBase::MetaEntry*,std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry*>>
                    *)&local_88,(MetaEntry **)&local_50);
      }
      lVar13 = lVar13 + 0x40;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  if ((this->super_PtexWriterBase)._header.metadatamemsize != 0) {
    uVar6 = PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,(void *)0x0,0,true);
    (this->super_PtexWriterBase)._header.metadatazipsize = uVar6;
  }
  if ((this->super_PtexWriterBase)._ok == true) {
    iVar9 = 8;
    do {
      iVar7 = 0x4000;
      if (iVar9 < 0x4000) {
        iVar7 = iVar9;
      }
      iVar7 = PtexWriterBase::writeBlock
                        (&this->super_PtexWriterBase,fp,PtexWriterBase::writeBlank::zeros,iVar7);
      iVar11 = iVar9 - iVar7;
      bVar5 = iVar7 <= iVar9;
      iVar9 = iVar11;
    } while (iVar11 != 0 && bVar5);
  }
  uVar16 = lStack_80 - (long)local_88 >> 3;
  uVar12 = (uint)uVar16;
  if (0 < (int)uVar12) {
    std::vector<long,_std::allocator<long>_>::vector
              (&local_50,(ulong)(uVar12 & 0x7fffffff),(allocator_type *)&local_68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_68,(ulong)(uVar12 & 0x7fffffff),(allocator_type *)&local_90);
    uVar14 = 0;
    do {
      lVar13 = *(long *)((long)local_88 + uVar14 * 8);
      pcVar10 = (pointer)ftello((FILE *)this->_tmpfp);
      (&((string *)
        local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start)->_M_dataplus)[uVar14]._M_p = pcVar10;
      data = *(void **)(lVar13 + 0x28);
      uVar8 = PtexWriterBase::writeZipBlock
                        (&this->super_PtexWriterBase,this->_tmpfp,data,
                         *(int *)(lVar13 + 0x30) - (int)data,true);
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14] = uVar8;
      uVar14 = uVar14 + 1;
    } while ((uVar12 & 0x7fffffff) != uVar14);
    uVar14 = 1;
    if (1 < (int)uVar12) {
      uVar14 = uVar16 & 0xffffffff;
    }
    uVar15 = 0;
    local_38 = uVar16;
    do {
      puVar4 = *(undefined8 **)((long)local_88 + uVar15 * 8);
      local_92 = *(char *)(puVar4 + 1) + 1;
      local_91 = *(undefined1 *)(puVar4 + 4);
      local_90 = *(int *)(puVar4 + 6) - *(int *)(puVar4 + 5);
      local_8c = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15];
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&local_92,1,false);
      PtexWriterBase::writeZipBlock
                (&this->super_PtexWriterBase,fp,(void *)*puVar4,(uint)local_92,false);
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&local_91,1,false);
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&local_90,4,false);
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&local_8c,4,false);
      (this->super_PtexWriterBase)._extheader.lmdheadermemsize =
           (uint)local_92 + (this->super_PtexWriterBase)._extheader.lmdheadermemsize + 10;
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
    uVar6 = PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,(void *)0x0,0,true);
    (this->super_PtexWriterBase)._extheader.lmdheaderzipsize = uVar6;
    uVar16 = 1;
    if (1 < (int)local_38) {
      uVar16 = local_38 & 0xffffffff;
    }
    uVar14 = 0;
    do {
      iVar9 = PtexWriterBase::copyBlock
                        (&this->super_PtexWriterBase,fp,this->_tmpfp,
                         (FilePos)(&((string *)
                                    local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                    .super__Vector_impl_data._M_start)->_M_dataplus)[uVar14]._M_p,
                         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar14]);
      puVar2 = &(this->super_PtexWriterBase)._extheader.lmddatasize;
      *puVar2 = *puVar2 + (long)iVar9;
      uVar14 = uVar14 + 1;
    } while (uVar16 != uVar14);
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((MetaEntry *)
        local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (MetaEntry *)0x0) {
      operator_delete(local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_88 != (void *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  return;
}

Assistant:

void PtexMainWriter::writeMetaData(FILE* fp)
{
    std::vector<MetaEntry*> lmdEntries; // large meta data items

    // write small meta data items in a single zip block
    for (int i = 0, n = (int)_metadata.size(); i < n; i++) {
        MetaEntry& e = _metadata[i];
#ifndef PTEX_NO_LARGE_METADATA_BLOCKS
        if (int(e.data.size()) > MetaDataThreshold) {
            // skip large items, but record for later
            lmdEntries.push_back(&e);
        }
        else
#endif
    {
            // add small item to zip block
            _header.metadatamemsize += writeMetaDataBlock(fp, e);
        }
    }
    if (_header.metadatamemsize) {
        // finish zip block
        _header.metadatazipsize = writeZipBlock(fp, 0, 0, /*finish*/ true);
    }

    // write compatibility barrier
    writeBlank(fp, sizeof(uint64_t));

    // write large items as separate blocks
    int nLmd = (int)lmdEntries.size();
    if (nLmd > 0) {
        // write data records to tmp file and accumulate zip sizes for lmd header
        std::vector<FilePos> lmdoffset(nLmd);
        std::vector<uint32_t> lmdzipsize(nLmd);
        for (int i = 0; i < nLmd; i++) {
            MetaEntry* e= lmdEntries[i];
            lmdoffset[i] = ftello(_tmpfp);
            lmdzipsize[i] = writeZipBlock(_tmpfp, &e->data[0], (int)e->data.size());
        }

        // write lmd header records as single zip block
        for (int i = 0; i < nLmd; i++) {
            MetaEntry* e = lmdEntries[i];
            uint8_t keysize = uint8_t(e->key.size()+1);
            uint8_t datatype = e->datatype;
            uint32_t datasize = (uint32_t)e->data.size();
            uint32_t zipsize = lmdzipsize[i];

            writeZipBlock(fp, &keysize, sizeof(keysize), false);
            writeZipBlock(fp, e->key.c_str(), keysize, false);
            writeZipBlock(fp, &datatype, sizeof(datatype), false);
            writeZipBlock(fp, &datasize, sizeof(datasize), false);
            writeZipBlock(fp, &zipsize, sizeof(zipsize), false);
            _extheader.lmdheadermemsize +=
                (uint32_t)(sizeof(keysize) + (size_t)keysize + sizeof(datatype) +
                           sizeof(datasize) + sizeof(zipsize));
        }
        _extheader.lmdheaderzipsize = writeZipBlock(fp, 0, 0, /*finish*/ true);

        // copy data records
        for (int i = 0; i < nLmd; i++) {
            _extheader.lmddatasize +=
                copyBlock(fp, _tmpfp, lmdoffset[i], lmdzipsize[i]);
        }
    }
}